

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool square_trap_flag(chunk_conflict2 *c,loc_conflict grid,wchar_t flag)

{
  _Bool _Var1;
  trap *local_30;
  trap *trap;
  wchar_t flag_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  local_30 = square_trap((chunk *)c,grid);
  _Var1 = square_istrap((chunk *)c,grid);
  if (_Var1) {
    for (; local_30 != (trap *)0x0; local_30 = local_30->next) {
      _Var1 = flag_has_dbg(local_30->flags,3,flag,"trap->flags","flag");
      if (_Var1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool square_trap_flag(struct chunk *c, struct loc grid, int flag)
{
    struct trap *trap = square_trap(c, grid);

    /* First, check the trap marker */
    if (!square_istrap(c, grid))
		return false;
	
    /* Scan the square trap list */
    while (trap) {
		/* We found a trap with the right flag */
		if (trf_has(trap->flags, flag))
			return true;
		trap = trap->next;
    }

    /* Report failure */
    return false;
}